

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bip32.c
# Opt level: O2

int bip32_key_from_base58(char *base58,ext_key *output)

{
  int iVar1;
  size_t written;
  uchar bytes [82];
  
  iVar1 = wally_base58_to_bytes(base58,1,bytes,0x52,&written);
  if (iVar1 == 0) {
    if (written == 0x4e) {
      iVar1 = bip32_key_unserialize(bytes,0x4e,output);
    }
    else {
      iVar1 = -2;
    }
    wally_clear(bytes,0x52);
  }
  return iVar1;
}

Assistant:

int bip32_key_from_base58(const char *base58,
                          struct ext_key *output)
{
    int ret;
    unsigned char bytes[BIP32_SERIALIZED_LEN + BASE58_CHECKSUM_LEN];
    size_t written;

    if ((ret = wally_base58_to_bytes(base58, BASE58_FLAG_CHECKSUM, bytes, sizeof(bytes), &written)))
        return ret;

    if (written != BIP32_SERIALIZED_LEN)
        ret = WALLY_EINVAL;
    else
        ret = bip32_key_unserialize(bytes, BIP32_SERIALIZED_LEN, output);

    wally_clear(bytes, sizeof(bytes));
    return ret;
}